

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  agc_t *agc;
  vector_t *ppfVar4;
  vector_t pfVar5;
  cmn_type_t cmn;
  agc_type_t agc_00;
  int32 iVar6;
  int iVar7;
  uint32 uVar8;
  uint uVar9;
  cmd_ln_t *pcVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  int32 **subvecs;
  char *pcVar15;
  model_inventory_t *minv;
  char *fn_00;
  char *base;
  uint32 *puVar16;
  vector_t ***ppppfVar17;
  lexicon_t *prior_lex;
  FILE *__stream;
  gauden_t *g;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  gauden_t *pgVar21;
  ulong uVar22;
  model_def_t *pmVar23;
  cmn_t *pcVar24;
  feat_t *pfVar25;
  double dVar26;
  model_def_t *mdef;
  uint32 n_mllr;
  uint32 n_cb;
  uint32 n_ts;
  feat_t *local_1098;
  uint32 tmp_n_stream;
  char *local_1088;
  long local_1080;
  uint32 n_map;
  int32 *mllr_idx;
  model_def_t *local_1068;
  char *local_1060;
  float32 ***sxfrm_b;
  float32 ****sxfrm_a;
  long local_1048;
  uint32 tmp_n_mllrcls;
  char fn [4097];
  
  mllr_idx = (int32 *)0x0;
  sxfrm_a = (float32 ****)0x0;
  sxfrm_b = (float32 ***)0x0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
          ,0xc9,"Compiled on %s at %s\n","Apr 25 2025","23:24:41");
  train_cmd_ln_parse(argc,argv);
  pcVar10 = cmd_ln_get();
  pcVar11 = cmd_ln_str_r(pcVar10,"-feat");
  pcVar10 = cmd_ln_get();
  pcVar12 = cmd_ln_str_r(pcVar10,"-cmn");
  cmn = cmn_type_from_str(pcVar12);
  pcVar10 = cmd_ln_get();
  lVar13 = cmd_ln_int_r(pcVar10,"-varnorm");
  pcVar10 = cmd_ln_get();
  pcVar12 = cmd_ln_str_r(pcVar10,"-agc");
  agc_00 = agc_type_from_str(pcVar12);
  pcVar10 = cmd_ln_get();
  lVar14 = cmd_ln_int_r(pcVar10,"-ceplen");
  local_1098 = feat_init(pcVar11,cmn,(uint)(lVar13 != 0),agc_00,1,(int32)lVar14);
  pcVar10 = cmd_ln_get();
  pcVar11 = cmd_ln_str_r(pcVar10,"-lda");
  if (pcVar11 == (char *)0x0) {
LAB_0010b4b2:
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-svspec");
    if (pcVar11 != (char *)0x0) {
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-svspec");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0xe3,"Using subvector specification %s\n",pcVar11);
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-svspec");
      subvecs = parse_subvecs(pcVar11);
      if ((subvecs == (int32 **)0x0) || (iVar7 = feat_set_subvecs(local_1098,subvecs), iVar7 < 0))
      goto LAB_0010c495;
    }
    pcVar10 = cmd_ln_get();
    iVar7 = cmd_ln_exists_r(pcVar10,"-agcthresh");
    pfVar25 = local_1098;
    if (iVar7 != 0) {
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-agc");
      iVar7 = strcmp(pcVar11,"none");
      if (iVar7 != 0) {
        agc = pfVar25->agc_struct;
        pcVar10 = cmd_ln_get();
        dVar26 = cmd_ln_float_r(pcVar10,"-agcthresh");
        agc_set_threshold(agc,(float32)(float)dVar26);
      }
    }
    if (pfVar25->cmn_struct != (cmn_t *)0x0) {
      pcVar10 = cmd_ln_get();
      iVar7 = cmd_ln_exists_r(pcVar10,"-cmninit");
      if (iVar7 != 0) {
        pcVar10 = cmd_ln_get();
        pcVar11 = cmd_ln_str_r(pcVar10,"-cmninit");
        pcVar11 = __ckd_salloc__(pcVar11,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                 ,0xf5);
        pcVar24 = pfVar25->cmn_struct;
        if (0 < pcVar24->veclen) {
          pcVar15 = strchr(pcVar11,0x2c);
          pcVar12 = pcVar11;
          if (pcVar15 == (char *)0x0) {
            lVar13 = 0;
          }
          else {
            lVar13 = 0;
            do {
              *pcVar15 = '\0';
              dVar26 = atof(pcVar12);
              pcVar24 = pfVar25->cmn_struct;
              pcVar24->cmn_mean[lVar13] = (mfcc_t)(float)dVar26;
              lVar13 = lVar13 + 1;
              if (pcVar24->veclen <= lVar13) goto LAB_0010b687;
              pcVar12 = pcVar15 + 1;
              pcVar15 = strchr(pcVar12,0x2c);
            } while (pcVar15 != (char *)0x0);
          }
          if (*pcVar12 != '\0') {
            dVar26 = atof(pcVar12);
            pcVar24->cmn_mean[lVar13] = (mfcc_t)(float)dVar26;
          }
        }
LAB_0010b687:
        ckd_free(pcVar11);
      }
    }
    minv = mod_inv_new();
    uVar8 = pfVar25->n_sv;
    if (uVar8 == 0) {
      uVar8 = pfVar25->n_stream;
    }
    mod_inv_set_n_feat(minv,uVar8);
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-moddeffn");
    pcVar10 = cmd_ln_get();
    local_1088 = cmd_ln_str_r(pcVar10,"-meanfn");
    pcVar10 = cmd_ln_get();
    pcVar12 = cmd_ln_str_r(pcVar10,"-varfn");
    pcVar10 = cmd_ln_get();
    pcVar15 = cmd_ln_str_r(pcVar10,"-mixwfn");
    pcVar10 = cmd_ln_get();
    fn_00 = cmd_ln_str_r(pcVar10,"-tmatfn");
    pcVar10 = cmd_ln_get();
    local_1060 = cmd_ln_str_r(pcVar10,"-fdictfn");
    pcVar10 = cmd_ln_get();
    base = cmd_ln_str_r(pcVar10,"-hmmdir");
    if (base != (char *)0x0) {
      if (pcVar11 == (char *)0x0) {
        pcVar11 = string_join(base,"/mdef",0);
      }
      if (local_1088 == (char *)0x0) {
        local_1088 = string_join(base,"/means",0);
      }
      if (pcVar12 == (char *)0x0) {
        pcVar12 = string_join(base,"/variances",0);
      }
      if (pcVar15 == (char *)0x0) {
        pcVar15 = string_join(base,"/mixture_weights",0);
      }
      if (fn_00 == (char *)0x0) {
        fn_00 = string_join(base,"/transition_matrices",0);
      }
      if (local_1060 == (char *)0x0) {
        local_1060 = string_join(base,"/noisedict",0);
      }
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x122,"Reading %s\n",pcVar11);
    iVar6 = model_def_read(&mdef,pcVar11);
    if (iVar6 != 0) goto LAB_0010c495;
    local_1068 = mdef;
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-ts2cbfn");
    if (pcVar11 == (char *)0x0) {
      pcVar11 = "Specify -ts2cbfn\n";
      lVar13 = 0x12f;
      goto LAB_0010c4a8;
    }
    iVar7 = strcmp(pcVar11,".semi.");
    if (iVar7 == 0) {
      puVar16 = semi_ts2cb(mdef->n_tied_state);
      mdef->cb = puVar16;
      n_ts = mdef->n_tied_state;
      n_cb = 1;
    }
    else {
      iVar7 = strcmp(pcVar11,".cont.");
      if (iVar7 == 0) {
        puVar16 = cont_ts2cb(mdef->n_tied_state);
        mdef->cb = puVar16;
        n_cb = mdef->n_tied_state;
        n_ts = n_cb;
      }
      else {
        iVar7 = strcmp(pcVar11,".ptm.");
        if (iVar7 == 0) {
          puVar16 = ptm_ts2cb(mdef);
          mdef->cb = puVar16;
          n_ts = mdef->n_tied_state;
          n_cb = mdef->acmod_set->n_ci;
        }
        else {
          iVar7 = s3ts2cb_read(pcVar11,&mdef->cb,&n_ts,&n_cb);
          if (iVar7 != 0) goto LAB_0010c495;
        }
      }
    }
    pmVar23 = mdef;
    minv->acmod_set = mdef->acmod_set;
    minv->mdef = mdef;
    pcVar10 = cmd_ln_get();
    dVar26 = cmd_ln_float_r(pcVar10,"-mwfloor");
    iVar6 = mod_inv_read_mixw(minv,pmVar23,pcVar15,(float32)(float)dVar26);
    if (iVar6 != 0) goto LAB_0010c495;
    if (n_ts != minv->n_mixw) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x150,"%u mappings from tied-state to cb, but %u tied-state in %s\n",
              (ulong)mdef->n_cb,(ulong)minv->n_mixw,pcVar15);
    }
    pcVar10 = cmd_ln_get();
    dVar26 = cmd_ln_float_r(pcVar10,"-tpfloor");
    iVar6 = mod_inv_read_tmat(minv,fn_00,(float32)(float)dVar26);
    if (iVar6 != 0) goto LAB_0010c495;
    pcVar10 = cmd_ln_get();
    dVar26 = cmd_ln_float_r(pcVar10,"-varfloor");
    local_1080 = CONCAT44(local_1080._4_4_,(float)dVar26);
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-topn");
    pcVar10 = cmd_ln_get();
    lVar14 = cmd_ln_int_r(pcVar10,"-fullvar");
    iVar6 = mod_inv_read_gauden(minv,local_1088,pcVar12,(float32)local_1080,(uint32)lVar13,
                                (int32)lVar14);
    if (iVar6 != 0) {
      pcVar10 = cmd_ln_get();
      lVar13 = cmd_ln_int_r(pcVar10,"-fullvar");
      if ((int)lVar13 != 0) {
        pcVar10 = cmd_ln_get();
        dVar26 = cmd_ln_float_r(pcVar10,"-varfloor");
        local_1080 = CONCAT44(local_1080._4_4_,(float)dVar26);
        pcVar10 = cmd_ln_get();
        lVar13 = cmd_ln_int_r(pcVar10,"-topn");
        iVar6 = mod_inv_read_gauden(minv,local_1088,pcVar12,(float32)local_1080,(uint32)lVar13,0);
        if (iVar6 == 0) goto LAB_0010baad;
      }
      goto LAB_0010c495;
    }
LAB_0010baad:
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-diagfull");
    if (((int)lVar13 != 0) && (pgVar21 = minv->gauden, pgVar21->var == (vector_t ***)0x0)) {
      ppppfVar17 = gauden_alloc_param(pgVar21->n_mgau,pgVar21->n_feat,pgVar21->n_density,
                                      pgVar21->veclen);
      pgVar21->var = ppppfVar17;
      uVar9 = pgVar21->n_mgau;
      if ((ulong)uVar9 != 0) {
        uVar1 = pgVar21->n_feat;
        uVar18 = 0;
        do {
          if ((ulong)uVar1 != 0) {
            uVar2 = pgVar21->n_density;
            uVar19 = 0;
            do {
              if ((ulong)uVar2 != 0) {
                uVar3 = pgVar21->veclen[uVar19];
                uVar20 = 0;
                do {
                  if ((ulong)uVar3 != 0) {
                    ppfVar4 = pgVar21->fullvar[uVar18][uVar19][uVar20];
                    pfVar5 = ppppfVar17[uVar18][uVar19][uVar20];
                    uVar22 = 0;
                    do {
                      pfVar5[uVar22] = ppfVar4[uVar22][uVar22];
                      uVar22 = uVar22 + 1;
                    } while (uVar3 != uVar22);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar2);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar1);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar9);
      }
      gauden_free_param_full(pgVar21->fullvar);
      pgVar21->fullvar = (vector_t ****)0x0;
      gauden_floor_variance(pgVar21);
    }
    iVar7 = gauden_eval_precomp(minv->gauden);
    if (iVar7 != 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x184,"Problems precomputing values used during Gaussian density evaluation\n");
      goto LAB_0010c495;
    }
    if (minv->gauden->n_mgau != n_cb) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x189,"# of codebooks in mean/var files, %u, inconsistent with ts2cb mapping %u\n");
      goto LAB_0010c495;
    }
    pcVar10 = cmd_ln_get();
    pcVar11 = (char *)cmd_ln_int_r(pcVar10,"-mixwreest");
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-meanreest");
    pcVar10 = cmd_ln_get();
    lVar14 = cmd_ln_int_r(pcVar10,"-varreest");
    pcVar10 = cmd_ln_get();
    local_1048 = cmd_ln_int_r(pcVar10,"-tmatreest");
    pcVar15 = "";
    pcVar12 = "";
    if ((int)pcVar11 == 0) {
      pcVar12 = "NOT ";
    }
    local_1088 = pcVar11;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x193,"Will %sreestimate mixing weights.\n",pcVar12);
    pcVar11 = "";
    if ((int)lVar13 == 0) {
      pcVar11 = "NOT ";
    }
    local_1080 = lVar13;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x195,"Will %sreestimate means.\n",pcVar11);
    pcVar11 = "";
    if ((int)lVar14 == 0) {
      pcVar11 = "NOT ";
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x197,"Will %sreestimate variances.\n",pcVar11);
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-mixwreest");
    if (((int)lVar13 != 0) && (iVar6 = mod_inv_alloc_mixw_acc(minv), iVar6 != 0)) goto LAB_0010c495;
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-tmatreest");
    if ((int)lVar13 == 0) {
      pcVar15 = "NOT ";
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x19f,"Will %sreestimate transition matrices\n",pcVar15);
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-tmatreest");
    if (((int)lVar13 != 0) && (iVar6 = mod_inv_alloc_tmat_acc(minv), iVar6 != 0)) goto LAB_0010c495;
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-meanreest");
    if ((int)lVar13 == 0) {
      pcVar10 = cmd_ln_get();
      lVar13 = cmd_ln_int_r(pcVar10,"-varreest");
      if ((int)lVar13 != 0) goto LAB_0010bd57;
    }
    else {
LAB_0010bd57:
      iVar6 = mod_inv_alloc_gauden_acc(minv);
      if (iVar6 != 0) goto LAB_0010c495;
    }
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-dictfn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x1ac,"Reading main dictionary: %s\n",pcVar11);
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-dictfn");
    prior_lex = lexicon_read((lexicon_t *)0x0,pcVar11,mdef->acmod_set);
    pcVar11 = local_1060;
    if (prior_lex == (lexicon_t *)0x0) goto LAB_0010c495;
    if (local_1060 != (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x1b6,"Reading filler dictionary: %s\n",local_1060);
      lexicon_read(prior_lex,pcVar11,mdef->acmod_set);
    }
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-cepdir");
    corpus_set_mfcc_dir(pcVar11);
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-cepext");
    corpus_set_mfcc_ext(pcVar11);
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-lsnfn");
    pcVar10 = cmd_ln_get();
    if (pcVar11 == (char *)0x0) {
      pcVar11 = cmd_ln_str_r(pcVar10,"-sentdir");
      corpus_set_sent_dir(pcVar11);
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-sentext");
      corpus_set_sent_ext(pcVar11);
    }
    else {
      pcVar11 = cmd_ln_str_r(pcVar10,"-lsnfn");
      corpus_set_lsn_filename(pcVar11);
    }
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-ctlfn");
    if (pcVar11 != (char *)0x0) {
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-ctlfn");
      corpus_set_ctl_filename(pcVar11);
    }
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-phsegdir");
    if (pcVar11 != (char *)0x0) {
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-phsegdir");
      corpus_set_phseg_dir(pcVar11);
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-phsegext");
      corpus_set_phseg_ext(pcVar11);
    }
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-accumdir");
    if (pcVar11 == (char *)0x0) {
LAB_0010bff6:
      pcVar10 = cmd_ln_get();
      lVar13 = cmd_ln_int_r(pcVar10,"-nskip");
      if ((int)lVar13 != 0) {
        pcVar10 = cmd_ln_get();
        lVar13 = cmd_ln_int_r(pcVar10,"-runlen");
        if ((int)lVar13 != 0) {
          pcVar10 = cmd_ln_get();
          lVar13 = cmd_ln_int_r(pcVar10,"-nskip");
          pcVar10 = cmd_ln_get();
          lVar14 = cmd_ln_int_r(pcVar10,"-runlen");
          corpus_set_interval((uint32)lVar13,(uint32)lVar14);
          pmVar23 = local_1068;
          pfVar25 = local_1098;
          goto LAB_0010c17e;
        }
      }
      pcVar10 = cmd_ln_get();
      lVar13 = cmd_ln_int_r(pcVar10,"-part");
      pmVar23 = local_1068;
      pfVar25 = local_1098;
      if ((int)lVar13 != 0) {
        pcVar10 = cmd_ln_get();
        lVar13 = cmd_ln_int_r(pcVar10,"-npart");
        if ((int)lVar13 != 0) {
          pcVar10 = cmd_ln_get();
          lVar13 = cmd_ln_int_r(pcVar10,"-part");
          pcVar10 = cmd_ln_get();
          lVar14 = cmd_ln_int_r(pcVar10,"-npart");
          corpus_set_partition((uint32)lVar13,(uint32)lVar14);
        }
      }
LAB_0010c17e:
      corpus_init();
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-mllrmat");
      if (pcVar11 == (char *)0x0) goto LAB_0010c384;
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-mllrmat");
      iVar6 = read_reg_mat(pcVar11,(uint32 **)fn,&tmp_n_mllrcls,&tmp_n_stream,&sxfrm_a,&sxfrm_b);
      if (iVar6 != 0) {
        pcVar10 = cmd_ln_get();
        pcVar11 = cmd_ln_str_r(pcVar10,"-mllrmat");
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x216,"Unable to read %s\n",pcVar11);
        goto LAB_0010c4b4;
      }
      uVar9 = pfVar25->n_sv;
      if (uVar9 == 0) {
        uVar9 = pfVar25->n_stream;
      }
      if (uVar9 == tmp_n_stream) {
        if (pfVar25->lda == (mfcc_t ***)0x0) {
          puVar16 = pfVar25->sv_len;
          if (puVar16 == (uint32 *)0x0) {
            puVar16 = pfVar25->stream_len;
          }
        }
        else {
          puVar16 = &pfVar25->out_dim;
        }
        if (uVar9 != 0) {
          uVar18 = 0;
          do {
            uVar1 = *(uint *)(fn._0_8_ + uVar18 * 4);
            if (puVar16[uVar18] != uVar1) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                      ,0x222,
                      "# components of stream %u in -mllrmat inconsistent w/ -feat config (%u != %u)\n"
                      ,uVar18,(ulong)uVar1,(ulong)puVar16[uVar18]);
              goto LAB_0010c4b4;
            }
            uVar18 = uVar18 + 1;
          } while (uVar9 != uVar18);
        }
        ckd_free((void *)fn._0_8_);
        pcVar10 = cmd_ln_get();
        pcVar11 = cmd_ln_str_r(pcVar10,"-cb2mllrfn");
        if (pcVar11 == (char *)0x0) {
          pgVar21 = minv->gauden;
          uVar8 = pgVar21->n_mgau;
        }
        else {
          iVar7 = strcmp(pcVar11,".1cls.");
          if (iVar7 == 0) {
            mllr_idx = (int32 *)__ckd_calloc__((ulong)minv->gauden->n_mgau,4,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                               ,0x22a);
            n_mllr = 1;
            pgVar21 = minv->gauden;
            uVar8 = pgVar21->n_mgau;
            n_map = uVar8;
          }
          else {
            pcVar10 = cmd_ln_get();
            pcVar11 = cmd_ln_str_r(pcVar10,"-cb2mllrfn");
            iVar7 = s3cb2mllr_read(pcVar11,&mllr_idx,&n_map,&n_mllr);
            if (iVar7 != 0) goto LAB_0010c495;
            pgVar21 = minv->gauden;
            uVar8 = n_map;
            if (n_map != pgVar21->n_mgau) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                      ,0x236,"cb2mllr maps %u cb, but read %u cb from files\n",(ulong)n_map);
              goto LAB_0010c4b4;
            }
          }
        }
        mllr_transform_mean(pgVar21->mean,pgVar21->var,0,uVar8,pgVar21->n_feat,pgVar21->n_density,
                            pgVar21->veclen,sxfrm_a,sxfrm_b,mllr_idx,n_mllr);
        ckd_free(mllr_idx);
        free_mllr_A(sxfrm_a,n_mllr,tmp_n_stream);
        free_mllr_B(sxfrm_b,n_mllr,tmp_n_stream);
LAB_0010c384:
        pcVar10 = cmd_ln_get();
        lVar13 = cmd_ln_int_r(pcVar10,"-mmie");
        if ((int)lVar13 == 0) {
          pcVar10 = cmd_ln_get();
          lVar13 = cmd_ln_int_r(pcVar10,"-viterbi");
          main_reestimate(minv,prior_lex,pmVar23,pfVar25,(int32)lVar13);
        }
        else {
          main_mmi_reestimate(minv,prior_lex,pmVar23,pfVar25);
        }
        if (pfVar25 != (feat_t *)0x0) {
          feat_free(pfVar25);
        }
        if (pmVar23 != (model_def_t *)0x0) {
          model_def_free(pmVar23);
        }
        mod_inv_free(minv);
        lexicon_free(prior_lex);
        return 0;
      }
      pcVar11 = "# feature streams in -mllrmat %s != # feature streams configured on cmd ln\n";
      lVar13 = 0x21a;
    }
    else {
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-accumdir");
      sprintf(fn,"%s/ckpt",pcVar11);
      __stream = fopen(fn,"r");
      if (__stream == (FILE *)0x0) goto LAB_0010bff6;
      fclose(__stream);
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-accumdir");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x1e6,"RESTORING CHECKPOINTED COUNTS IN %s\n",pcVar11);
      if (local_1098->lda == (mfcc_t ***)0x0) {
        puVar16 = local_1098->sv_len;
        if (puVar16 == (uint32 *)0x0) {
          puVar16 = local_1098->stream_len;
        }
      }
      else {
        puVar16 = &local_1098->out_dim;
      }
      pcVar10 = cmd_ln_get();
      pcVar11 = cmd_ln_str_r(pcVar10,"-accumdir");
      iVar7 = mod_inv_restore_acc(minv,pcVar11,(int)local_1088,(int)local_1080,(int)lVar14,
                                  (int)local_1048,puVar16);
      if (iVar7 == 0) {
        iVar7 = corpus_ckpt_set_interval(fn);
        pmVar23 = local_1068;
        pfVar25 = local_1098;
        if (iVar7 != 0) {
          pcVar11 = "Unable to restore corpus state information\n";
          lVar13 = 0x1f5;
          goto LAB_0010c4a8;
        }
        uVar8 = corpus_get_begin();
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x1f8,"Resuming at utt %u\n",(ulong)uVar8);
        goto LAB_0010c17e;
      }
      pcVar11 = "Unable to restore checkpoint information\n";
      lVar13 = 0x1f1;
    }
  }
  else {
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-lda");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0xd9,"Reading linear feature transformation from %s\n",pcVar11);
    pcVar10 = cmd_ln_get();
    pcVar11 = cmd_ln_str_r(pcVar10,"-lda");
    pcVar10 = cmd_ln_get();
    lVar13 = cmd_ln_int_r(pcVar10,"-ldadim");
    iVar6 = feat_read_lda(local_1098,pcVar11,(int32)lVar13);
    if (-1 < iVar6) goto LAB_0010b4b2;
LAB_0010c495:
    pcVar11 = "initialization failed\n";
    lVar13 = 0x714;
  }
LAB_0010c4a8:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
          ,lVar13,pcVar11);
LAB_0010c4b4:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    model_inventory_t *inv;
    lexicon_t *lex = NULL;
    model_def_t *mdef = NULL;
    feat_t *feat = NULL;
    
    if (main_initialize(argc, argv,
			&inv, &lex, &mdef, &feat) != S3_SUCCESS) {
	E_FATAL("initialization failed\n");
    }

    if (cmd_ln_int32("-mmie")) {
      main_mmi_reestimate(inv, lex, mdef, feat);
    }
    else {
      main_reestimate(inv, lex, mdef, feat, cmd_ln_int32("-viterbi"));
    }
    
    if (feat)
	feat_free(feat);
    if (mdef)
	model_def_free(mdef);    
    if (inv)
	mod_inv_free(inv);
    if (lex)
	lexicon_free(lex);

    return 0;
}